

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureMultisampleTests::init
          (TextureMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  TestContext *testCtx;
  _func_int **pp_Var2;
  char *description;
  int samples;
  int extraout_EAX;
  TestNode *pTVar3;
  undefined8 *puVar4;
  TestNode *pTVar5;
  SampleMaskCase *pSVar6;
  long *plVar7;
  bool bVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  long *local_228;
  undefined8 local_220;
  long local_218;
  undefined8 uStack_210;
  int local_204;
  long local_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  TestNode *local_1b8;
  TestNode *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_200 = 0;
  local_1b8 = (TestNode *)this;
  do {
    pTVar3 = (TestNode *)operator_new(0x70);
    testCtx = ((TestNode *)this)->m_testCtx;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"samples_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    local_204 = init::sampleCounts[local_200];
    std::ostream::operator<<((ostringstream *)&local_1a8,local_204);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    samples = local_204;
    uVar10 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar10 = local_1e8[0];
    }
    if (uVar10 < (ulong)(local_1d0 + local_1f0)) {
      uVar10 = 0xf;
      if (local_1d8 != local_1c8) {
        uVar10 = local_1c8[0];
      }
      if (uVar10 < (ulong)(local_1d0 + local_1f0)) goto LAB_0152005a;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
    }
    else {
LAB_0152005a:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
    }
    plVar7 = puVar4 + 2;
    if ((long *)*puVar4 == plVar7) {
      local_218 = *plVar7;
      uStack_210 = puVar4[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar7;
      local_228 = (long *)*puVar4;
    }
    local_220 = puVar4[1];
    *puVar4 = plVar7;
    puVar4[1] = 0;
    *(undefined1 *)plVar7 = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,testCtx,(char *)local_228,"Test with N samples");
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    pTVar5 = (TestNode *)operator_new(0xe8);
    pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"sample_position","test SAMPLE_POSITION");
    pTVar5[1]._vptr_TestNode = pp_Var2;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__SamplePosRasterizationTest_02169c18;
    *(int *)&pTVar5[1].m_testCtx = samples;
    *(undefined4 *)((long)&pTVar5[1].m_testCtx + 4) = 0x100;
    pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x0;
    pTVar5[1].m_name._M_string_length = 0;
    *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0;
    pTVar5[1].m_name.field_2._M_local_buf[0xc] = '\x01';
    pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
    *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
    pTVar5[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar5[1].m_description.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar5[1].m_description.field_2 + 8) = 0;
    *(undefined8 *)((long)&pTVar5[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar5[1].field_0x54 = 0;
    pTVar5[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_ffffffffffffffff;
    *(undefined4 *)&pTVar5[2]._vptr_TestNode = 0xffffffff;
    tcu::TestNode::addChild(pTVar3,pTVar5);
    pSVar6 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "sample_mask_only","Test with SampleMask only",samples,0);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar6);
    pSVar6 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "sample_mask_and_alpha_to_coverage","Test with SampleMask and alpha to coverage",
               samples,1);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar6);
    pSVar6 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "sample_mask_and_sample_coverage","Test with SampleMask and sample coverage",samples,
               2);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar6);
    pSVar6 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "sample_mask_and_sample_coverage_and_alpha_to_coverage",
               "Test with SampleMask, sample coverage, and alpha to coverage",samples,3);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar6);
    pSVar6 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar6,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "sample_mask_non_effective_bits",
               "Test with SampleMask, set higher bits than sample count",samples,4);
    local_1b0 = pTVar3;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar6);
    lVar11 = 0;
    do {
      pTVar3 = (TestNode *)operator_new(0xa0);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_228 = &local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"use_","");
      description = *(char **)((long)&init::textureTypes[0].name + lVar11);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_198 = *plVar9;
        lStack_190 = plVar7[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar9;
        local_1a8 = (long *)*plVar7;
      }
      local_1a0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar1 = *(uint *)((long)&init::textureTypes[0].type + lVar11);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar3,(TestContext *)*pp_Var2,(char *)local_1a8,description);
      pTVar3[1]._vptr_TestNode = pp_Var2;
      pTVar3->_vptr_TestNode = (_func_int **)&PTR__MultisampleTextureUsageCase_02169cb8;
      *(uint *)&pTVar3[1].m_testCtx = uVar1;
      *(int *)((long)&pTVar3[1].m_testCtx + 4) = local_204;
      pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar3[1].m_name._M_string_length = 0;
      pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar3[1].m_name.field_2._M_local_buf[8] = uVar1 < 2;
      pTVar3[1].m_name.field_2._M_local_buf[9] = (uVar1 & 0xfffffffe) == 2;
      pTVar3[1].m_name.field_2._M_local_buf[10] = (uVar1 & 0xfffffffe) == 4;
      pTVar3[1].m_name.field_2._M_local_buf[0xb] = uVar1 == 6 || uVar1 == 7;
      if ((5 < uVar1) || (bVar8 = true, (0x2aU >> (uVar1 & 0x1f) & 1) == 0)) {
        bVar8 = uVar1 == 7;
      }
      pTVar3[1].m_name.field_2._M_local_buf[0xc] = bVar8;
      tcu::TestNode::addChild(local_1b0,pTVar3);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      this = (TextureMultisampleTests *)local_1b8;
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x80);
    local_200 = local_200 + 1;
    if (local_200 == 10) {
      pTVar3 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"negative","Negative tests");
      tcu::TestNode::addChild((TestNode *)this,pTVar3);
      pTVar5 = (TestNode *)operator_new(0x90);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,
                 "fbo_attach_different_sample_count_tex_tex","Attach different sample counts");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeFramebufferCase_02169d08;
      pTVar5[1].m_testCtx = (TestContext *)0x4000000000;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xffffffff00008058;
      *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0xffffffff;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x90);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,
                 "fbo_attach_different_sample_count_tex_rbo","Attach different sample counts");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeFramebufferCase_02169d08;
      pTVar5[1].m_testCtx = (TestContext *)0x4000000001;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xffffffff00008058;
      *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0xffffffff;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x90);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,
                 "fbo_attach_different_fixed_state_tex_tex","Attach fixed and non fixed");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeFramebufferCase_02169d08;
      pTVar5[1].m_testCtx = (TestContext *)0x4000000002;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xffffffff00008058;
      *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0xffffffff;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x90);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,
                 "fbo_attach_different_fixed_state_tex_rbo","Attach fixed and non fixed");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeFramebufferCase_02169d08;
      pTVar5[1].m_testCtx = (TestContext *)0x4000000003;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xffffffff00008058;
      *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0xffffffff;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x90);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"fbo_attach_non_zero_level",
                 "Attach non-zero level");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeFramebufferCase_02169d08;
      pTVar5[1].m_testCtx = (TestContext *)0x4000000004;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xffffffff00008058;
      *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0xffffffff;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_min_filter",
                 "set TEXTURE_MIN_FILTER");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x0;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_mag_filter",
                 "set TEXTURE_MAG_FILTER");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)&DAT_00000001;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_wrap_s","set TEXTURE_WRAP_S");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x2;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_wrap_t","set TEXTURE_WRAP_T");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x3;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_wrap_r","set TEXTURE_WRAP_R");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)&DAT_00000004;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_min_lod","set TEXTURE_MIN_LOD")
      ;
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x5;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_max_lod","set TEXTURE_MAX_LOD")
      ;
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x6;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_compare_mode",
                 "set TEXTURE_COMPARE_MODE");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x7;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_compare_func",
                 "set TEXTURE_COMPARE_FUNC");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x8;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_base_level",
                 "set TEXTURE_BASE_LEVEL");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__NegativeTexParameterCase_02169d58;
      pTVar5[1].m_testCtx = (TestContext *)0x9;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_high_sample_count",
                 "TexStorage with high numSamples");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02169e40;
      *(undefined4 *)&pTVar5[1].m_testCtx = 0;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x80);
      pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,(TestContext *)*pp_Var2,"texture_zero_sample_count",
                 "TexStorage with zero numSamples");
      pTVar5[1]._vptr_TestNode = pp_Var2;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02169e40;
      *(undefined4 *)&pTVar5[1].m_testCtx = 1;
      tcu::TestNode::addChild(pTVar3,pTVar5);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TextureMultisampleTests::init (void)
{
	static const int sampleCounts[] = { 1, 2, 3, 4, 8, 10, 12, 13, 16, 64 };

	static const struct TextureType
	{
		const char*									name;
		MultisampleTextureUsageCase::TextureType	type;
	} textureTypes[] =
	{
		{ "texture_color_2d",		MultisampleTextureUsageCase::TEXTURE_COLOR_2D		},
		{ "texture_color_2d_array",	MultisampleTextureUsageCase::TEXTURE_COLOR_2D_ARRAY	},
		{ "texture_int_2d",			MultisampleTextureUsageCase::TEXTURE_INT_2D			},
		{ "texture_int_2d_array",	MultisampleTextureUsageCase::TEXTURE_INT_2D_ARRAY	},
		{ "texture_uint_2d",		MultisampleTextureUsageCase::TEXTURE_UINT_2D		},
		{ "texture_uint_2d_array",	MultisampleTextureUsageCase::TEXTURE_UINT_2D_ARRAY	},
		{ "texture_depth_2d",		MultisampleTextureUsageCase::TEXTURE_DEPTH_2D		},
		{ "texture_depth_2d_array",	MultisampleTextureUsageCase::TEXTURE_DEPTH_2D_ARRAY	},
	};

	// .samples_x
	for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleNdx)
	{
		tcu::TestCaseGroup* const sampleGroup = new tcu::TestCaseGroup(m_testCtx, (std::string("samples_") + de::toString(sampleCounts[sampleNdx])).c_str(), "Test with N samples");
		addChild(sampleGroup);

		// position query works
		sampleGroup->addChild(new SamplePosRasterizationTest(m_context, "sample_position", "test SAMPLE_POSITION", sampleCounts[sampleNdx]));

		// sample mask is ANDed properly
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_only",											"Test with SampleMask only",									sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_NONE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_alpha_to_coverage",						"Test with SampleMask and alpha to coverage",					sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_ALPHA_TO_COVERAGE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_sample_coverage",							"Test with SampleMask and sample coverage",						sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_SAMPLE_COVERAGE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_sample_coverage_and_alpha_to_coverage",	"Test with SampleMask, sample coverage, and alpha to coverage",	sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_ALPHA_TO_COVERAGE | SampleMaskCase::FLAGS_SAMPLE_COVERAGE));

		// high bits cause no unexpected behavior
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_non_effective_bits",							"Test with SampleMask, set higher bits than sample count",		sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_HIGH_BITS));

		// usage
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(textureTypes); ++typeNdx)
			sampleGroup->addChild(new MultisampleTextureUsageCase(m_context, (std::string("use_") + textureTypes[typeNdx].name).c_str(), textureTypes[typeNdx].name, sampleCounts[sampleNdx], textureTypes[typeNdx].type));
	}

	// .negative
	{
		tcu::TestCaseGroup* const negativeGroup = new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests");
		addChild(negativeGroup);

		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_sample_count_tex_tex",	"Attach different sample counts",	NegativeFramebufferCase::CASE_DIFFERENT_N_SAMPLES_TEX));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_sample_count_tex_rbo",	"Attach different sample counts",	NegativeFramebufferCase::CASE_DIFFERENT_N_SAMPLES_RBO));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_fixed_state_tex_tex",		"Attach fixed and non fixed",		NegativeFramebufferCase::CASE_DIFFERENT_FIXED_TEX));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_fixed_state_tex_rbo",		"Attach fixed and non fixed",		NegativeFramebufferCase::CASE_DIFFERENT_FIXED_RBO));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_non_zero_level",					"Attach non-zero level",			NegativeFramebufferCase::CASE_NON_ZERO_LEVEL));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_min_filter",							"set TEXTURE_MIN_FILTER",			NegativeTexParameterCase::TEXTURE_MIN_FILTER));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_mag_filter",							"set TEXTURE_MAG_FILTER",			NegativeTexParameterCase::TEXTURE_MAG_FILTER));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_s",								"set TEXTURE_WRAP_S",				NegativeTexParameterCase::TEXTURE_WRAP_S));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_t",								"set TEXTURE_WRAP_T",				NegativeTexParameterCase::TEXTURE_WRAP_T));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_r",								"set TEXTURE_WRAP_R",				NegativeTexParameterCase::TEXTURE_WRAP_R));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_min_lod",								"set TEXTURE_MIN_LOD",				NegativeTexParameterCase::TEXTURE_MIN_LOD));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_max_lod",								"set TEXTURE_MAX_LOD",				NegativeTexParameterCase::TEXTURE_MAX_LOD));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_compare_mode",							"set TEXTURE_COMPARE_MODE",			NegativeTexParameterCase::TEXTURE_COMPARE_MODE));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_compare_func",							"set TEXTURE_COMPARE_FUNC",			NegativeTexParameterCase::TEXTURE_COMPARE_FUNC));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_base_level",							"set TEXTURE_BASE_LEVEL",			NegativeTexParameterCase::TEXTURE_BASE_LEVEL));
		negativeGroup->addChild(new NegativeTexureSampleCase(m_context, "texture_high_sample_count",					"TexStorage with high numSamples",	NegativeTexureSampleCase::SAMPLECOUNT_HIGH));
		negativeGroup->addChild(new NegativeTexureSampleCase(m_context, "texture_zero_sample_count",					"TexStorage with zero numSamples",	NegativeTexureSampleCase::SAMPLECOUNT_ZERO));
	}
}